

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMouseClicked(ImGuiMouseButton button,bool repeat)

{
  float *pfVar1;
  float t1;
  int iVar2;
  byte in_SIL;
  int in_EDI;
  int amount;
  float t;
  ImGuiContext *g;
  bool local_1;
  
  t1 = (GImGui->IO).MouseDownDuration[in_EDI];
  if ((t1 != 0.0) || (NAN(t1))) {
    if (((in_SIL & 1) == 0) ||
       ((pfVar1 = &(GImGui->IO).KeyRepeatDelay, t1 < *pfVar1 || t1 == *pfVar1 ||
        (iVar2 = CalcTypematicRepeatAmount
                           (t1 - (GImGui->IO).DeltaTime,t1,(GImGui->IO).KeyRepeatDelay,
                            (GImGui->IO).KeyRepeatRate * 0.5), iVar2 < 1)))) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ImGui::IsMouseClicked(ImGuiMouseButton button, bool repeat)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    const float t = g.IO.MouseDownDuration[button];
    if (t == 0.0f)
        return true;

    if (repeat && t > g.IO.KeyRepeatDelay)
    {
        // FIXME: 2019/05/03: Our old repeat code was wrong here and led to doubling the repeat rate, which made it an ok rate for repeat on mouse hold.
        int amount = CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate * 0.50f);
        if (amount > 0)
            return true;
    }
    return false;
}